

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

char * rsrc_basename(char *name,size_t name_length)

{
  void *pvVar1;
  char *r;
  char *s;
  size_t name_length_local;
  char *name_local;
  
  r = name;
  while( true ) {
    pvVar1 = memchr(r,0x2f,name_length - ((long)r - (long)name));
    if (pvVar1 == (void *)0x0) break;
    r = (char *)((long)pvVar1 + 1);
  }
  return r;
}

Assistant:

static const char *
rsrc_basename(const char *name, size_t name_length)
{
	const char *s, *r;

	r = s = name;
	for (;;) {
		s = memchr(s, '/', name_length - (s - name));
		if (s == NULL)
			break;
		r = ++s;
	}
	return (r);
}